

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.cpp
# Opt level: O3

int16_t __thiscall wasm::Random::get16(Random *this)

{
  uint uVar1;
  byte bVar2;
  pointer pcVar3;
  uint uVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  
  sVar6 = this->pos;
  pcVar3 = (this->bytes).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  sVar5 = (long)(this->bytes).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)pcVar3;
  if (sVar6 == sVar5) {
    this->finishedInput = true;
    uVar4 = this->xorFactor + 1;
    this->xorFactor = uVar4;
    sVar6 = 0;
  }
  else {
    uVar4 = this->xorFactor;
  }
  sVar7 = sVar6 + 1;
  this->pos = sVar7;
  bVar2 = pcVar3[sVar6];
  uVar1 = uVar4;
  if (sVar7 == sVar5) {
    this->finishedInput = true;
    uVar1 = uVar4 + 1;
    this->xorFactor = uVar1;
    sVar7 = 0;
  }
  this->pos = sVar7 + 1;
  return (short)(char)((byte)uVar1 ^ pcVar3[sVar7]) | (ushort)(byte)(bVar2 ^ (byte)uVar4) << 8;
}

Assistant:

int16_t Random::get16() {
  auto temp = uint16_t(get()) << 8;
  return temp | uint16_t(get());
}